

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsInput
helicsFederateRegisterSubscription(HelicsFederate fed,char *key,char *units,HelicsError *err)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *puVar2;
  ulong uVar3;
  ValueFederate *pVVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  InputObject *pIVar6;
  size_t sVar7;
  size_t sVar8;
  Input *pIVar9;
  ulong uVar10;
  pointer *__ptr;
  const_iterator __position;
  _Alloc_hider _Var11;
  _Alloc_hider _Var12;
  FedObject *fedObj;
  string_view target;
  string_view units_00;
  _Head_base<0UL,_helics::InputObject_*,_false> local_58;
  InputObject *local_50;
  ValueFederate *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  HelicsError *local_38;
  
  local_38 = err;
  getValueFedSharedPtr(&local_48,(HelicsError *)fed);
  pVVar4 = local_48;
  if (local_48 == (ValueFederate *)0x0) {
    pIVar6 = (InputObject *)0x0;
  }
  else {
    pIVar6 = (InputObject *)operator_new(0x20);
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pIVar6->inputPtr = (Input *)0x0;
    *(undefined8 *)pIVar6 = 0;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sVar7 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var12 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    local_50 = pIVar6;
    if (key != (char *)0x0) {
      sVar7 = strlen(key);
      _Var12._M_p = key;
    }
    sVar8 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var11._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      sVar8 = strlen(units);
      _Var11._M_p = units;
    }
    target._M_str = _Var12._M_p;
    target._M_len = sVar7;
    units_00._M_str = _Var11._M_p;
    units_00._M_len = sVar8;
    pIVar9 = helics::ValueFederate::registerSubscription(pVVar4,target,units_00);
    p_Var5 = p_Stack_40;
    pVVar4 = local_48;
    pIVar6->inputPtr = pIVar9;
    local_48 = (ValueFederate *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pVVar4;
    (pIVar6->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      pIVar6 = local_50;
    }
    local_50 = (InputObject *)0x0;
    pIVar6->valid = 0x3456e052;
    __position._M_current =
         *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
          ((long)fed + 0x50);
    puVar2 = *(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> **)
              ((long)fed + 0x58);
    local_58._M_head_impl = pIVar6;
    if ((__position._M_current == puVar2) ||
       (iVar1 = (pIVar6->inputPtr->super_Interface).handle.hid,
       ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>._M_t.
         super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
         super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
      ::emplace_back<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>
                ((vector<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>,std::allocator<std::unique_ptr<helics::InputObject,std::default_delete<helics::InputObject>>>>
                  *)((long)fed + 0x50),
                 (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                 &local_58);
    }
    else {
      uVar10 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar10, 0 < (long)uVar3) {
        uVar10 = uVar3 >> 1;
        if (((__position._M_current[uVar10]._M_t.
              super___uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_>.
              _M_t.
              super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>
              .super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl)->inputPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar10 + 1;
          uVar10 = ~uVar10 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
                        *)((long)fed + 0x50),__position,(value_type *)&local_58);
    }
    if (local_58._M_head_impl != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_58,local_58._M_head_impl);
    }
    local_58._M_head_impl = (InputObject *)0x0;
    if (local_50 != (InputObject *)0x0) {
      std::default_delete<helics::InputObject>::operator()
                ((default_delete<helics::InputObject> *)&local_50,local_50);
    }
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return pIVar6;
}

Assistant:

HelicsInput helicsFederateRegisterSubscription(HelicsFederate fed, const char* key, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto sub = std::make_unique<helics::InputObject>();
        sub->inputPtr = &fedObj->registerSubscription(AS_STRING_VIEW(key), AS_STRING_VIEW(units));
        sub->fedptr = std::move(fedObj);
        return addInput(fed, std::move(sub));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
    // LCOV_EXCL_STOP
}